

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreationTest.cpp
# Opt level: O0

void __thiscall
TApp_IncorrectConstructionTakeLastExpected_Test::TestBody
          (TApp_IncorrectConstructionTakeLastExpected_Test *this)

{
  bool bVar1;
  Option *this_00;
  AssertHelper local_c8;
  Message local_c0 [2];
  IncorrectConstruction *anon_var_0;
  char *pcStack_a8;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  Message local_98;
  undefined4 local_90;
  allocator local_89;
  string local_88;
  allocator local_51;
  string local_50;
  Option *local_30;
  Option *cat;
  vector<int,_std::allocator<int>_> vec;
  TApp_IncorrectConstructionTakeLastExpected_Test *this_local;
  
  vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  CLI::std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&cat);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"--vec",&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_88,"",&local_89);
  this_00 = CLI::App::add_option<int>
                      (&(this->super_TApp).app,&local_50,(vector<int,_std::allocator<int>_> *)&cat,
                       &local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  local_30 = this_00;
  CLI::Option::expected(this_00,1);
  bVar1 = testing::internal::AlwaysTrue();
  if (!bVar1) {
    testing::Message::Message(&local_98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0xa2,
               "Expected: cat->multi_option_policy(CLI::MultiOptionPolicy::TakeLast) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg,&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg);
    testing::Message::~Message(&local_98);
    local_90 = 1;
    goto LAB_00117c75;
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    CLI::Option::multi_option_policy(local_30,TakeLast);
  }
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffff58,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffff58);
  if (bVar1) {
    anon_var_0._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      CLI::Option::expected(local_30,2);
    }
    if ((anon_var_0._7_1_ & 1) == 0) {
      pcStack_a8 = 
      "Expected: cat->expected(2) throws an exception of type CLI::IncorrectConstruction.\n  Actual: it throws nothing."
      ;
      goto LAB_00117bd4;
    }
  }
  else {
LAB_00117bd4:
    testing::Message::Message(local_c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0xa3,pcStack_a8);
    testing::internal::AssertHelper::operator=(&local_c8,local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::Message::~Message(local_c0);
  }
  local_90 = 0;
LAB_00117c75:
  CLI::std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&cat);
  return;
}

Assistant:

TEST_F(TApp, IncorrectConstructionTakeLastExpected) {
    std::vector<int> vec;
    auto cat = app.add_option("--vec", vec);
    cat->expected(1);
    ASSERT_NO_THROW(cat->multi_option_policy(CLI::MultiOptionPolicy::TakeLast));
    EXPECT_THROW(cat->expected(2), CLI::IncorrectConstruction);
}